

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::parser::expect(parser *this,token_type t)

{
  invalid_argument *this_00;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string error_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_f0 [32];
  string local_d0 [8];
  lexer *in_stack_ffffffffffffff38;
  bool local_aa;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [20];
  token_type in_stack_ffffffffffffffac;
  undefined1 local_31 [49];
  
  if (in_ESI != (int)in_RDI[1]._M_string_length) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_31 + 1),"parse error - unexpected ",(allocator *)__rhs);
    std::allocator<char>::~allocator((allocator<char> *)local_31);
    local_aa = (int)in_RDI[1]._M_string_length != 0xe;
    if (local_aa) {
      lexer::token_type_name(in_stack_ffffffffffffffac);
    }
    else {
      lexer::get_token_string(in_stack_ffffffffffffff38);
      std::operator+((char *)in_RDI,__rhs);
      std::operator+(in_RDI,(char *)__rhs);
    }
    local_aa = !local_aa;
    std::__cxx11::string::operator+=((string *)(local_31 + 1),local_68);
    std::__cxx11::string::~string(local_68);
    if (local_aa) {
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
    }
    lexer::token_type_name(in_stack_ffffffffffffffac);
    std::operator+((char *)in_RDI,__rhs);
    std::__cxx11::string::operator+=((string *)(local_31 + 1),local_d0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_f0);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,(string *)(local_31 + 1));
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void expect(typename lexer::token_type t) const
        {
            if (t != last_token)
            {
                std::string error_msg = "parse error - unexpected ";
                error_msg += (last_token == lexer::token_type::parse_error ? ("'" +  m_lexer.get_token_string() +
                              "'") :
                              lexer::token_type_name(last_token));
                error_msg += "; expected " + lexer::token_type_name(t);
                JSON_THROW(std::invalid_argument(error_msg));
            }
        }